

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O2

void __thiscall Assimp::ObjFileMtlImporter::getColorRGBA(ObjFileMtlImporter *this,aiColor3D *pColor)

{
  uint uVar1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var2;
  ai_real aVar3;
  ai_real aVar4;
  ai_real b;
  ai_real g;
  ai_real r;
  ai_real local_2c;
  ai_real local_28;
  ai_real local_24;
  
  if (pColor == (aiColor3D *)0x0) {
    __assert_fail("__null != pColor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Obj/ObjFileMtlImporter.cpp"
                  ,0xf2,"void Assimp::ObjFileMtlImporter::getColorRGBA(aiColor3D *)");
  }
  local_24 = 0.0;
  local_28 = 0.0;
  local_2c = 0.0;
  _Var2 = getFloat<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&local_24);
  (this->m_DataIt)._M_current = _Var2._M_current;
  pColor->r = local_24;
  _Var2._M_current = (this->m_DataIt)._M_current;
  uVar1 = (uint)(byte)*_Var2._M_current;
  if (uVar1 < 0xe) {
    aVar3 = 0.0;
    aVar4 = 0.0;
    if ((0x3401U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_005a0d3a;
  }
  _Var2 = getFloat<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    (_Var2,(this->m_DataItEnd)._M_current,&local_28);
  (this->m_DataIt)._M_current = _Var2._M_current;
  _Var2 = getFloat<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    (_Var2,(this->m_DataItEnd)._M_current,&local_2c);
  (this->m_DataIt)._M_current = _Var2._M_current;
  aVar3 = local_2c;
  aVar4 = local_28;
LAB_005a0d3a:
  pColor->g = aVar4;
  pColor->b = aVar3;
  return;
}

Assistant:

void ObjFileMtlImporter::getColorRGBA( aiColor3D *pColor )
{
    ai_assert( NULL != pColor );

    ai_real r( 0.0 ), g( 0.0 ), b( 0.0 );
    m_DataIt = getFloat<DataArrayIt>( m_DataIt, m_DataItEnd, r );
    pColor->r = r;

    // we have to check if color is default 0 with only one token
    if( !IsLineEnd( *m_DataIt ) ) {
        m_DataIt = getFloat<DataArrayIt>( m_DataIt, m_DataItEnd, g );
        m_DataIt = getFloat<DataArrayIt>( m_DataIt, m_DataItEnd, b );
    }
    pColor->g = g;
    pColor->b = b;
}